

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_path_relative(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  size_t sVar2;
  curi_status local_4c;
  curi_status tryStatus;
  size_t initialOffset_1;
  curi_status status;
  size_t initialOffset;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  sVar1 = *offset;
  initialOffset_1._4_4_ = curi_status_success;
  sVar2 = *offset;
  local_4c = parse_segment(uri,len,offset,settings,userData,1);
  if (local_4c == curi_status_success) {
    local_4c = parse_segments(uri,len,offset,settings,userData);
  }
  if (local_4c == curi_status_error) {
    *offset = sVar2;
  }
  else {
    initialOffset_1._4_4_ = local_4c;
  }
  if (initialOffset_1._4_4_ == curi_status_success) {
    initialOffset_1._4_4_ = handle_path(uri + sVar1,*offset - sVar1,settings,userData);
  }
  return initialOffset_1._4_4_;
}

Assistant:

static curi_status parse_path_relative(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // path-relative = segment-not-empty segments
    const size_t initialOffset = *offset;
    curi_status status = curi_status_success;

    if (status == curi_status_success)
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_success;

        if (tryStatus == curi_status_success)
            tryStatus = parse_segment(uri, len, offset, settings, userData, 1);

        if (tryStatus == curi_status_success)
            tryStatus = parse_segments(uri, len, offset, settings, userData);

        if (tryStatus == curi_status_error)
            *offset = initialOffset;
        else
            status = tryStatus;
    }

    if (status == curi_status_success)
        status = handle_path(uri + initialOffset, *offset - initialOffset, settings, userData);

    return status;
}